

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::option_has_no_value_exception::option_has_no_value_exception
          (option_has_no_value_exception *this,string *option)

{
  size_type sVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *local_a8;
  size_type local_a0;
  size_type local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = option->_M_string_length;
  if (sVar1 == 0) {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Option has no value","");
  }
  else {
    std::operator+(&local_48,"Option ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::LQUOTE_abi_cxx11_);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_48,(option->_M_dataplus)._M_p,option->_M_string_length);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if (paVar5 == paVar4) {
      local_88.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_88.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_88._M_dataplus._M_p = (pointer)paVar5;
    }
    local_88._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_88,(anonymous_namespace)::RQUOTE_abi_cxx11_,DAT_0015d728);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if (paVar5 == paVar4) {
      local_68.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)paVar5;
    }
    local_68._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_68," has no value");
    local_a8 = &local_98;
    psVar2 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2 == paVar5) {
      local_98 = paVar5->_M_allocated_capacity;
      uStack_90 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_98 = paVar5->_M_allocated_capacity;
      local_a8 = psVar2;
    }
    local_a0 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_0015c570;
  paVar5 = &(this->super_OptionException).m_message.field_2;
  (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)paVar5;
  if (local_a8 == &local_98) {
    paVar5->_M_allocated_capacity = local_98;
    *(undefined8 *)((long)&(this->super_OptionException).m_message.field_2 + 8) = uStack_90;
  }
  else {
    (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)local_a8;
    (this->super_OptionException).m_message.field_2._M_allocated_capacity = local_98;
  }
  (this->super_OptionException).m_message._M_string_length = local_a0;
  local_a0 = 0;
  local_98 = local_98 & 0xffffffffffffff00;
  if (sVar1 != 0) {
    local_a8 = &local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_0015cd28;
  return;
}

Assistant:

explicit option_has_no_value_exception(const std::string& option)
    : OptionException(
        !option.empty() ?
        ("Option " + LQUOTE + option + RQUOTE + " has no value") :
        "Option has no value")
    {
    }